

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_marktrace(global_State *g,TraceNo traceno)

{
  uint64_t uVar1;
  GCobj *o;
  TraceNo traceno_local;
  global_State *g_local;
  
  uVar1 = *(uint64_t *)(g[1].ctype_state.ptr64 + (ulong)traceno * 8);
  if ((*(byte *)(uVar1 + 8) & 3) != 0) {
    *(byte *)(uVar1 + 8) = *(byte *)(uVar1 + 8) & 0xfc;
    *(uint64_t *)(uVar1 + 0x18) = (g->gc).gray.gcptr64;
    (g->gc).gray.gcptr64 = uVar1;
  }
  return;
}

Assistant:

static void gc_marktrace(global_State *g, TraceNo traceno)
{
  GCobj *o = obj2gco(traceref(G2J(g), traceno));
  lj_assertG(traceno != G2J(g)->cur.traceno, "active trace escaped");
  if (iswhite(o)) {
    white2gray(o);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}